

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O3

void __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
dijkstra_sssp(uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *src,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
             *d,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *prev)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  _List_node_base *p_Var2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  _List_node_base *p_Var5;
  set<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  PQ;
  anon_class_24_3_3321debf relax;
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  long *local_110;
  long local_108;
  long local_100 [2];
  float local_f0;
  key_type local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_c0
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Rb_tree<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  anon_class_24_3_3321debf local_48;
  
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_assign_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)prev,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0);
  local_48.PQ = (set<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_78;
  local_c8 = src;
  local_c0 = this;
  local_48.d = d;
  local_48.prev = prev;
  p_Var2 = (_List_node_base *)vertices(this);
  p_Var5 = p_Var2;
  while (__k = local_c8,
        p_Var5 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != p_Var2) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
             ::operator[](d,(key_type *)(p_Var5 + 1));
    *pmVar3 = INFINITY;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](prev,(key_type *)(p_Var5 + 1));
    std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x10bb05);
  }
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
           ::operator[](d,local_c8);
  *pmVar3 = 0.0;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
           ::operator[](d,__k);
  local_138._0_4_ = *pmVar3;
  pcVar1 = (__k->_M_dataplus)._M_p;
  local_130._M_p = (pointer)&local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar1,pcVar1 + __k->_M_string_length);
  std::
  _Rb_tree<std::pair<float,std::__cxx11::string>,std::pair<float,std::__cxx11::string>,std::_Identity<std::pair<float,std::__cxx11::string>>,std::less<std::pair<float,std::__cxx11::string>>,std::allocator<std::pair<float,std::__cxx11::string>>>
  ::_M_insert_unique<std::pair<float,std::__cxx11::string>>
            ((_Rb_tree<std::pair<float,std::__cxx11::string>,std::pair<float,std::__cxx11::string>,std::_Identity<std::pair<float,std::__cxx11::string>>,std::less<std::pair<float,std::__cxx11::string>>,std::allocator<std::pair<float,std::__cxx11::string>>>
              *)&local_78,
             (pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
  }
  if (local_78._M_impl.super__Rb_tree_header._M_node_count != 0) {
    do {
      local_130._M_p = (pointer)&local_120;
      local_138._0_4_ = local_78._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,
                 local_78._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent,
                 (long)&(local_78._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent)->
                        _M_color +
                 (long)&(local_78._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_left)->
                        _M_color);
      std::
      _Rb_tree<std::pair<float,std::__cxx11::string>,std::pair<float,std::__cxx11::string>,std::_Identity<std::pair<float,std::__cxx11::string>>,std::less<std::pair<float,std::__cxx11::string>>,std::allocator<std::pair<float,std::__cxx11::string>>>
      ::erase_abi_cxx11_((_Rb_tree<std::pair<float,std::__cxx11::string>,std::pair<float,std::__cxx11::string>,std::_Identity<std::pair<float,std::__cxx11::string>>,std::less<std::pair<float,std::__cxx11::string>>,std::allocator<std::pair<float,std::__cxx11::string>>>
                          *)&local_78,
                         (const_iterator)local_78._M_impl.super__Rb_tree_header._M_header._M_left);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_130._M_p,local_130._M_p + local_128);
      p_Var5 = (_List_node_base *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>_>_>
               ::operator[](&local_c0->adj,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      for (p_Var2 = (((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                       *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          p_Var2 != p_Var5;
          p_Var2 = (((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                      *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
        local_110 = local_100;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,p_Var2[1]._M_next,
                   (long)&(p_Var2[1]._M_prev)->_M_next + (long)p_Var2[1]._M_next);
        local_f0 = *(float *)&p_Var2[3]._M_next;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_130._M_p,local_130._M_p + local_128);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_110,local_108 + (long)local_110);
        dijkstra_sssp::anon_class_24_3_3321debf::operator()(&local_48,&local_98,&local_b8,local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_110 != local_100) {
          operator_delete(local_110,local_100[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_p != &local_120) {
        operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
      }
    } while (local_78._M_impl.super__Rb_tree_header._M_node_count != 0);
  }
  std::
  _Rb_tree<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_78);
  return;
}

Assistant:

void dijkstra_sssp(ver src, map<ver, float> &d, map<ver, ver> &prev) {
      set<pair<float, ver> > PQ;
      prev = {};
      auto relax = [&](ver u, ver v, float wt) {
          if (d[u] + wt < d[v]) {
            //In the set updating of a particular is not possible
            // we have to remove the old pair, and insert the new pair to simulation updating
            if (auto f = PQ.find({d[v], v});
                    f != PQ.end())
              PQ.erase(f);

            //Insert the new pair
            d[v] = d[u] + wt;
            prev[v] = u;
            PQ.insert({d[v], v});
          }
      };
      for (auto &v : vertices()) {
        d[v] = numeric_limits<float>::infinity();//set d[v] = +INF
        prev[v] = "";//set prev[v] -> NIL
      }

      d[src] = 0;
      PQ.insert({d[src], src});

      while (!PQ.empty()) {

        //Find the pair at the front.
        auto[ignore, u] = *(PQ.begin());

        PQ.erase(PQ.begin());
        //Iterate over neighbours/children of the current u
        for (auto[v, wt]: neighbours(u)) {
          relax(u, v, wt);//relax all neighbouring vertices
        }
      }
    }